

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

SPxLPBase<double> * __thiscall
soplex::SPxLPBase<double>::operator=(SPxLPBase<double> *this,SPxLPBase<double> *old)

{
  SPxLPBase<double> *in_RSI;
  SPxLPBase<double> *in_RDI;
  
  if (in_RDI != in_RSI) {
    LPRowSetBase<double>::operator=
              (&in_RSI->super_LPRowSetBase<double>,&in_RDI->super_LPRowSetBase<double>);
    LPColSetBase<double>::operator=((LPColSetBase<double> *)in_RSI,(LPColSetBase<double> *)in_RDI);
    in_RDI->thesense = in_RSI->thesense;
    in_RDI->offset = in_RSI->offset;
    in_RDI->_isScaled = (bool)(in_RSI->_isScaled & 1);
    in_RDI->lp_scaler = in_RSI->lp_scaler;
    in_RDI->spxout = in_RSI->spxout;
    std::shared_ptr<soplex::Tolerances>::operator=
              ((shared_ptr<soplex::Tolerances> *)in_RSI,(shared_ptr<soplex::Tolerances> *)in_RDI);
  }
  return in_RDI;
}

Assistant:

SPxLPBase<R>& operator=(const SPxLPBase<R>& old)
   {
      if(this != &old)
      {
         LPRowSetBase<R>::operator=(old);
         LPColSetBase<R>::operator=(old);
         thesense = old.thesense;
         offset = old.offset;
         _isScaled = old._isScaled;
         lp_scaler = old.lp_scaler;
         spxout = old.spxout;
         _tolerances = old._tolerances;

         assert(isConsistent());
      }

      return *this;
   }